

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_section.c
# Opt level: O0

int pt_section_map_share(pt_section *section)

{
  uint16_t uVar1;
  int errcode;
  uint16_t mcount;
  pt_section *section_local;
  
  if (section == (pt_section *)0x0) {
    section_local._4_4_ = -1;
  }
  else {
    section_local._4_4_ = pt_section_lock(section);
    if (-1 < section_local._4_4_) {
      if (section->mcount == 0) {
        pt_section_unlock(section);
        section_local._4_4_ = -1;
      }
      else {
        uVar1 = section->mcount + 1;
        if (uVar1 == 0) {
          pt_section_unlock(section);
          section_local._4_4_ = -0x19;
        }
        else {
          section->mcount = uVar1;
          section_local._4_4_ = pt_section_unlock(section);
        }
      }
    }
  }
  return section_local._4_4_;
}

Assistant:

int pt_section_map_share(struct pt_section *section)
{
	uint16_t mcount;
	int errcode;

	if (!section)
		return -pte_internal;

	errcode = pt_section_lock(section);
	if (errcode < 0)
		return errcode;

	mcount = section->mcount;
	if (!mcount) {
		(void) pt_section_unlock(section);
		return -pte_internal;
	}

	mcount += 1;
	if (!mcount) {
		(void) pt_section_unlock(section);
		return -pte_overflow;
	}

	section->mcount = mcount;

	return pt_section_unlock(section);
}